

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall Epoll::epoll_del(Epoll *this,int fd)

{
  int fd_local;
  
  fd_local = fd;
  std::
  _Hashtable<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->ep_event_map)._M_h,&fd_local);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (&(this->ep_listen_fds)._M_t,&fd_local);
  epoll_ctl(this->ep_epoll_fd,2,fd_local,(epoll_event *)0x0);
  return;
}

Assistant:

void Epoll::epoll_del(int fd) {

    ep_event_map.erase(fd);

    ep_listen_fds.erase(fd);

    epoll_ctl(ep_epoll_fd, EPOLL_CTL_DEL, fd, NULL);
}